

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O1

void duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>::
     Execute<long,long,duckdb::ArgMinMaxState<long,long>>
               (ArgMinMaxState<long,_long> *state,long x_data,long y_data,
               AggregateBinaryInput *binary)

{
  unsigned_long *puVar1;
  bool bVar2;
  
  puVar1 = (binary->right_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if ((puVar1 != (unsigned_long *)0x0) &&
     ((puVar1[binary->ridx >> 6] >> (binary->ridx & 0x3f) & 1) == 0)) {
    return;
  }
  if (y_data <= state->value) {
    return;
  }
  puVar1 = (binary->left_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar1 == (unsigned_long *)0x0) {
    (state->super_ArgMinMaxStateBase).arg_null = false;
  }
  else {
    bVar2 = (puVar1[binary->lidx >> 6] >> (binary->lidx & 0x3f) & 1) == 0;
    (state->super_ArgMinMaxStateBase).arg_null = bVar2;
    if (bVar2) goto LAB_018b0320;
  }
  state->arg = x_data;
LAB_018b0320:
  state->value = y_data;
  return;
}

Assistant:

static void Execute(STATE &state, A_TYPE x_data, B_TYPE y_data, AggregateBinaryInput &binary) {
		if ((IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) && COMPARATOR::Operation(y_data, state.value)) {
			Assign(state, x_data, y_data, !binary.left_mask.RowIsValid(binary.lidx));
		}
	}